

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  int *piVar7;
  void *__addr;
  ulong *puVar8;
  __sighandler_t p_Var9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _union_1457 _Var12;
  long lVar13;
  ulong uVar14;
  undefined8 uVar15;
  _union_1457 *p_Var16;
  const_iterator __position;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  ExecDeathTestArgs args_2;
  Arguments args;
  string internal_flag;
  string filter_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  _union_1457 local_2b0;
  long local_2a8;
  _union_1457 local_2a0;
  long lStack_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  string local_270;
  string local_250;
  int local_230;
  int local_22c;
  string local_228;
  int local_204;
  string local_200;
  string local_1e0;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  _union_1457 local_160;
  undefined1 local_158 [8];
  ulong local_150;
  ulong uStack_148;
  _union_1457 local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_204 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar3 = pipe(&local_230);
  if (iVar3 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_310 == puVar8) {
      local_300 = *puVar8;
      lStack_2f8 = puVar6[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar8;
    }
    local_308 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_2d0 == puVar8) {
      local_2c0 = *puVar8;
      lStack_2b8 = puVar6[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0 = *puVar8;
    }
    local_2c8 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x592;
    StreamableToString<int>((string *)&local_290,(int *)&local_250);
    uVar14 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar14 = local_2c0;
    }
    if (uVar14 < (ulong)(local_290._8_8_ + local_2c8)) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_allocated_capacity != &local_280) {
        uVar15 = local_280._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (ulong)(local_290._8_8_ + local_2c8)) goto LAB_0014a77d;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_0014a77d:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,local_290._M_allocated_capacity);
    }
    local_2b0.sa_handler = (__sighandler_t)*puVar6;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.sa_handler == paVar11) {
      local_2a0 = (_union_1457)paVar11->_M_allocated_capacity;
      lStack_298 = puVar6[3];
      local_2b0.sa_handler = (__sighandler_t)&local_2a0;
    }
    else {
      local_2a0 = (_union_1457)paVar11->_M_allocated_capacity;
    }
    local_2a8 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_160.sa_handler = (__sighandler_t)*puVar6;
    p_Var9 = (__sighandler_t)(puVar6 + 2);
    if (local_160.sa_handler == p_Var9) {
      local_150 = *(ulong *)p_Var9;
      uStack_148 = puVar6[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var9;
    }
    local_158 = (undefined1  [8])puVar6[1];
    *puVar6 = p_Var9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
LAB_0014ac8f:
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    local_c8.sa_handler = (__sighandler_t)*puVar6;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler != paVar11) goto LAB_0014a54b;
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar6[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
    goto LAB_0014a556;
  }
  iVar3 = fcntl(local_22c,2,0);
  if (iVar3 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_310 == puVar8) {
      local_300 = *puVar8;
      lStack_2f8 = puVar6[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar8;
    }
    local_308 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_2d0 == puVar8) {
      local_2c0 = *puVar8;
      lStack_2b8 = puVar6[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0 = *puVar8;
    }
    local_2c8 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x595;
    StreamableToString<int>((string *)&local_290,(int *)&local_250);
    uVar14 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar14 = local_2c0;
    }
    if (uVar14 < (ulong)(local_290._8_8_ + local_2c8)) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_allocated_capacity != &local_280) {
        uVar15 = local_280._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (ulong)(local_290._8_8_ + local_2c8)) goto LAB_0014a877;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_0014a877:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,local_290._M_allocated_capacity);
    }
    local_2b0.sa_handler = (__sighandler_t)*puVar6;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.sa_handler == paVar11) {
      local_2a0 = (_union_1457)paVar11->_M_allocated_capacity;
      lStack_298 = puVar6[3];
      local_2b0.sa_handler = (__sighandler_t)&local_2a0;
    }
    else {
      local_2a0 = (_union_1457)paVar11->_M_allocated_capacity;
    }
    local_2a8 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_160.sa_handler = (__sighandler_t)*puVar6;
    p_Var9 = (__sighandler_t)(puVar6 + 2);
    if (local_160.sa_handler == p_Var9) {
      local_150 = *(ulong *)p_Var9;
      uStack_148 = puVar6[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var9;
    }
    local_158 = (undefined1  [8])puVar6[1];
    *puVar6 = p_Var9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    goto LAB_0014ac8f;
  }
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = plVar5[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar8;
    local_310 = (ulong *)*plVar5;
  }
  local_308 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2c0 = *puVar8;
    lStack_2b8 = plVar5[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar8;
    local_2d0 = (ulong *)*plVar5;
  }
  local_2c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  p_Var16 = (_union_1457 *)(plVar5 + 2);
  if ((_union_1457 *)*plVar5 == p_Var16) {
    local_2a0 = *p_Var16;
    lStack_298 = plVar5[3];
    local_2b0.sa_handler = (__sighandler_t)&local_2a0;
  }
  else {
    local_2a0 = *p_Var16;
    local_2b0.sa_handler = (__sighandler_t)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)p_Var16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var9 = (__sighandler_t)(plVar5 + 2);
  if ((__sighandler_t)*plVar5 == p_Var9) {
    local_150 = *(ulong *)p_Var9;
    uStack_148 = plVar5[3];
  }
  else {
    local_150 = *(ulong *)p_Var9;
    local_160.sa_handler = (__sighandler_t)*plVar5;
  }
  local_158 = (undefined1  [8])plVar5[1];
  *plVar5 = (long)p_Var9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar11) {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar6[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar6;
  }
  local_c0 = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180 = &local_170;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_170 = *plVar10;
    lStack_168 = plVar5[3];
  }
  else {
    local_170 = *plVar10;
    local_180 = (long *)*plVar5;
  }
  local_178 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((_union_1457 *)local_2b0.sa_handler != &local_2a0) {
    operator_delete(local_2b0.sa_handler,(ulong)(local_2a0.sa_handler + 1));
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"--","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_270.field_2._M_allocated_capacity = *puVar8;
    local_270.field_2._8_8_ = plVar5[3];
  }
  else {
    local_270.field_2._M_allocated_capacity = *puVar8;
    local_270._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_270._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_250.field_2._M_allocated_capacity = *puVar8;
    local_250.field_2._8_8_ = plVar5[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar8;
    local_250._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_250._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_allocated_capacity = (size_type)&local_280;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar11) {
    local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_280._8_8_ = plVar5[3];
  }
  else {
    local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_290._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar5;
  }
  local_290._8_8_ = plVar5[1];
  *plVar5 = (long)paVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_290._M_local_buf);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2e0 = *puVar8;
    lStack_2d8 = plVar5[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar8;
    local_2f0 = (ulong *)*plVar5;
  }
  local_2e8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = plVar5[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar8;
    local_310 = (ulong *)*plVar5;
  }
  local_308 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  StreamableToString<int>(&local_1e0,&this->line_);
  uVar14 = 0xf;
  if (local_310 != &local_300) {
    uVar14 = local_300;
  }
  if (uVar14 < local_1e0._M_string_length + local_308) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      uVar15 = local_1e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_1e0._M_string_length + local_308) goto LAB_0014959b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_0014959b:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_1e0._M_dataplus._M_p);
  }
  puVar8 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar8) {
    local_2c0 = *puVar8;
    lStack_2b8 = puVar6[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar8;
    local_2d0 = (ulong *)*puVar6;
  }
  local_2c8 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  p_Var16 = (_union_1457 *)(plVar5 + 2);
  if ((_union_1457 *)*plVar5 == p_Var16) {
    local_2a0.sa_handler = p_Var16->sa_handler;
    lStack_298 = plVar5[3];
    local_2b0.sa_handler = (__sighandler_t)&local_2a0;
  }
  else {
    local_2a0.sa_handler = p_Var16->sa_handler;
    local_2b0.sa_handler = (__sighandler_t)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)p_Var16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  StreamableToString<int>(&local_200,&local_204);
  p_Var9 = (__sighandler_t)
           (CONCAT44(local_200._M_string_length._4_4_,(int)local_200._M_string_length) + local_2a8);
  _Var12 = (_union_1457)0xf;
  if ((_union_1457 *)local_2b0.sa_handler != &local_2a0) {
    _Var12 = local_2a0;
  }
  if ((ulong)_Var12 < p_Var9) {
    uVar15 = (__sighandler_t)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      uVar15 = local_200.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < p_Var9) goto LAB_001496b9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_2b0);
  }
  else {
LAB_001496b9:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_200._M_dataplus._M_p);
  }
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var9 = (__sighandler_t)(puVar6 + 2);
  if ((__sighandler_t)*puVar6 == p_Var9) {
    local_150 = *(ulong *)p_Var9;
    uStack_148 = puVar6[3];
  }
  else {
    local_150 = *(ulong *)p_Var9;
    local_160.sa_handler = (__sighandler_t)*puVar6;
  }
  local_158 = (undefined1  [8])puVar6[1];
  *puVar6 = p_Var9;
  puVar6[1] = 0;
  *p_Var9 = (__sighandler_t)0x0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar11) {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar6[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar6;
  }
  local_c0 = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  StreamableToString<int>(&local_1a0,&local_22c);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    uVar15 = local_b8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_c0 + local_1a0._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
        &local_1a0.field_2) {
      uVar15 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_c0 + local_1a0._M_string_length) goto LAB_0014980b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_0014980b:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_c8,
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_))
    ;
  }
  local_1c0 = &local_1b0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_1b0 = *plVar5;
    uStack_1a8 = puVar6[3];
  }
  else {
    local_1b0 = *plVar5;
    local_1c0 = (long *)*puVar6;
  }
  local_1b8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
      &local_1a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_),
                    local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,(ulong)(local_200.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((_union_1457 *)local_2b0.sa_handler != &local_2a0) {
    operator_delete(local_2b0.sa_handler,(ulong)(local_2a0.sa_handler + 1));
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity != &local_280) {
    operator_delete((void *)local_290._M_allocated_capacity,local_280._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  Arguments::Arguments((Arguments *)&local_1e0);
  GetInjectableArgvs_abi_cxx11_();
  Arguments::AddArguments<std::__cxx11::string>
            ((Arguments *)&local_1e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  __position._M_current = (char **)(local_1e0._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_180);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e0,__position,
             (value_type *)&local_c8.sa_handler);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_1c0);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e0,
             (char **)(local_1e0._M_string_length - 8),(value_type *)&local_c8.sa_handler);
  local_c8.sa_handler = (__sighandler_t)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  local_200._M_dataplus._M_p = local_1e0._M_dataplus._M_p;
  local_200._M_string_length._0_4_ = local_230;
  memset(&local_160,0,0x98);
  sigemptyset((sigset_t *)local_158);
  local_160 = (_union_1457)0x1;
  do {
    iVar3 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)&local_c8);
    cVar2 = FLAGS_gtest_death_test_use_fork;
    if (iVar3 != -1) {
      iVar3 = -1;
      if (FLAGS_gtest_death_test_use_fork == '\0') {
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
          AssumeRole();
        }
        iVar3 = getpagesize();
        __len = (size_t)(iVar3 * 2);
        __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
        if (__addr == (void *)0xffffffffffffffff) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_allocated_capacity = *puVar6;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_allocated_capacity == paVar11) {
            local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_280._8_8_ = puVar6[3];
            local_290._M_allocated_capacity = (size_type)&local_280;
          }
          else {
            local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_290._8_8_ = puVar6[1];
          *puVar6 = paVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
          local_2f0 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_2f0 == puVar8) {
            local_2e0 = *puVar8;
            lStack_2d8 = puVar6[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0 = *puVar8;
          }
          local_2e8 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          local_228._M_dataplus._M_p._0_4_ = 0x55b;
          StreamableToString<int>(&local_270,(int *)&local_228);
          uVar14 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar14 = local_2e0;
          }
          if (uVar14 < local_270._M_string_length + local_2e8) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              uVar15 = local_270.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_270._M_string_length + local_2e8) goto LAB_0014adc1;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0)
            ;
          }
          else {
LAB_0014adc1:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
          }
          local_310 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_310 == puVar8) {
            local_300 = *puVar8;
            lStack_2f8 = puVar6[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar8;
          }
          local_308 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)puVar8 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_2d0 == puVar8) {
            local_2c0 = *puVar8;
            lStack_2b8 = puVar6[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0 = *puVar8;
          }
          local_2c8 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
        }
        else {
          lVar13 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar13 = __len - 0x40;
          }
          if ((0x40 < (uint)(iVar3 * 2)) && (((ulong)(lVar13 + (long)__addr) & 0x3f) == 0)) {
            iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar13 + (long)__addr),0x11,&local_200);
            iVar4 = munmap(__addr,__len);
            if (iVar4 != -1) goto LAB_00149ca6;
            goto LAB_0014a981;
          }
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_allocated_capacity = *puVar6;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_allocated_capacity == paVar11) {
            local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_280._8_8_ = puVar6[3];
            local_290._M_allocated_capacity = (size_type)&local_280;
          }
          else {
            local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_290._8_8_ = puVar6[1];
          *puVar6 = paVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
          local_2f0 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_2f0 == puVar8) {
            local_2e0 = *puVar8;
            lStack_2d8 = puVar6[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0 = *puVar8;
          }
          local_2e8 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          local_228._M_dataplus._M_p._0_4_ = 0x569;
          StreamableToString<int>(&local_270,(int *)&local_228);
          uVar14 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar14 = local_2e0;
          }
          if (uVar14 < local_270._M_string_length + local_2e8) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              uVar15 = local_270.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_270._M_string_length + local_2e8) goto LAB_0014aed2;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0)
            ;
          }
          else {
LAB_0014aed2:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
          }
          local_310 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_310 == puVar8) {
            local_300 = *puVar8;
            lStack_2f8 = puVar6[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar8;
          }
          local_308 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)puVar8 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_2d0 == puVar8) {
            local_2c0 = *puVar8;
            lStack_2b8 = puVar6[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0 = *puVar8;
          }
          local_2c8 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
        }
      }
      else {
LAB_00149ca6:
        if ((cVar2 == '\0') || (iVar3 = fork(), iVar3 != 0)) {
          goto LAB_00149cc2;
        }
        ExecDeathTestChildMain(&local_200);
LAB_0014a981:
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"CHECK failed: File ","");
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
        local_290._M_allocated_capacity = *puVar6;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity == paVar11) {
          local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_280._8_8_ = puVar6[3];
          local_290._M_allocated_capacity = (size_type)&local_280;
        }
        else {
          local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_290._8_8_ = puVar6[1];
        *puVar6 = paVar11;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
        local_2f0 = (ulong *)*puVar6;
        puVar8 = puVar6 + 2;
        if (local_2f0 == puVar8) {
          local_2e0 = *puVar8;
          lStack_2d8 = puVar6[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0 = *puVar8;
        }
        local_2e8 = puVar6[1];
        *puVar6 = puVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_228._M_dataplus._M_p._0_4_ = 0x56d;
        StreamableToString<int>(&local_270,(int *)&local_228);
        uVar14 = 0xf;
        if (local_2f0 != &local_2e0) {
          uVar14 = local_2e0;
        }
        if (uVar14 < local_270._M_string_length + local_2e8) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            uVar15 = local_270.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_270._M_string_length + local_2e8) goto LAB_0014afe3;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
        }
        else {
LAB_0014afe3:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
        }
        local_310 = (ulong *)*puVar6;
        puVar8 = puVar6 + 2;
        if (local_310 == puVar8) {
          local_300 = *puVar8;
          lStack_2f8 = puVar6[3];
          local_310 = &local_300;
        }
        else {
          local_300 = *puVar8;
        }
        local_308 = puVar6[1];
        *puVar6 = puVar8;
        puVar6[1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
        local_2d0 = (ulong *)*puVar6;
        puVar8 = puVar6 + 2;
        if (local_2d0 == puVar8) {
          local_2c0 = *puVar8;
          lStack_2b8 = puVar6[3];
          local_2d0 = &local_2c0;
        }
        else {
          local_2c0 = *puVar8;
        }
        local_2c8 = puVar6[1];
        *puVar6 = puVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
      }
      goto LAB_0014a3a5;
    }
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)*plVar5;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)local_250._M_dataplus._M_p == puVar8) {
    local_250.field_2._M_allocated_capacity = *puVar8;
    local_250.field_2._8_8_ = plVar5[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar8;
  }
  local_250._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_allocated_capacity = *plVar5;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity == paVar11) {
    local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_280._8_8_ = plVar5[3];
    local_290._M_allocated_capacity = (size_type)&local_280;
  }
  else {
    local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_290._8_8_ = plVar5[1];
  *plVar5 = (long)paVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x54f;
  StreamableToString<int>(&local_228,(int *)&local_1a0);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity != &local_280) {
    uVar15 = local_280._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_228._M_string_length + local_290._8_8_) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar15 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_228._M_string_length + local_290._8_8_) goto LAB_00149f67;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_228,0,(char *)0x0,local_290._M_allocated_capacity);
  }
  else {
LAB_00149f67:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_290._M_local_buf,(ulong)local_228._M_dataplus._M_p);
  }
  local_2f0 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2f0 == puVar8) {
    local_2e0 = *puVar8;
    lStack_2d8 = puVar6[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar8;
  }
  local_2e8 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_310 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = puVar6[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar8;
  }
  local_308 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  goto LAB_0014a34a;
LAB_00149d57:
  do {
    iVar4 = close(local_22c);
    if (iVar4 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar3;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_230;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_1e0);
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      return OVERSEE_TEST;
    }
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  local_290._M_allocated_capacity = (size_type)&local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  puVar6 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
  local_2f0 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2f0 == puVar8) {
    local_2e0 = *puVar8;
    lStack_2d8 = puVar6[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar8;
  }
  local_2e8 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_310 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = puVar6[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar8;
  }
  local_308 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_270._M_dataplus._M_p._0_4_ = 0x5ac;
  StreamableToString<int>(&local_250,(int *)&local_270);
  uVar14 = 0xf;
  if (local_310 != &local_300) {
    uVar14 = local_300;
  }
  if (uVar14 < local_250._M_string_length + local_308) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar15 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_250._M_string_length + local_308) goto LAB_0014a1a4;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_0014a1a4:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_250._M_dataplus._M_p);
  }
  local_2d0 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2d0 == puVar8) {
    local_2c0 = *puVar8;
    lStack_2b8 = puVar6[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar8;
  }
  local_2c8 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0.sa_handler = (__sighandler_t)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.sa_handler == paVar11) {
    local_2a0 = (_union_1457)paVar11->_M_allocated_capacity;
    lStack_298 = puVar6[3];
    local_2b0.sa_handler = (__sighandler_t)&local_2a0;
  }
  else {
    local_2a0 = (_union_1457)paVar11->_M_allocated_capacity;
  }
  local_2a8 = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_160.sa_handler = (__sighandler_t)*plVar5;
  p_Var9 = (__sighandler_t)(plVar5 + 2);
  if (local_160.sa_handler == p_Var9) {
    local_150 = *(ulong *)p_Var9;
    uStack_148 = plVar5[3];
    local_160.sa_handler = (__sighandler_t)&local_150;
  }
  else {
    local_150 = *(ulong *)p_Var9;
  }
  local_158 = (undefined1  [8])plVar5[1];
  *plVar5 = (long)p_Var9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  local_c8.sa_handler = (__sighandler_t)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar11) {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar6[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
LAB_0014a54b:
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
  }
LAB_0014a556:
  _Var12 = *(_union_1457 *)(puVar6 + 1);
  p_Var16 = &local_c8;
  goto LAB_0014a562;
  while (piVar7 = __errno_location(), *piVar7 == 4) {
LAB_00149cc2:
    iVar4 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)0x0);
    if (iVar4 != -1) {
      if (iVar3 != -1) goto LAB_00149d57;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_allocated_capacity = *puVar6;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_allocated_capacity == paVar11) {
        local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_280._8_8_ = puVar6[3];
        local_290._M_allocated_capacity = (size_type)&local_280;
      }
      else {
        local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_290._8_8_ = puVar6[1];
      *puVar6 = paVar11;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
      local_2f0 = (ulong *)*puVar6;
      puVar8 = puVar6 + 2;
      if (local_2f0 == puVar8) {
        local_2e0 = *puVar8;
        lStack_2d8 = puVar6[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0 = *puVar8;
      }
      local_2e8 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_228._M_dataplus._M_p._0_4_ = 0x57d;
      StreamableToString<int>(&local_270,(int *)&local_228);
      uVar14 = 0xf;
      if (local_2f0 != &local_2e0) {
        uVar14 = local_2e0;
      }
      if (uVar14 < local_270._M_string_length + local_2e8) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          uVar15 = local_270.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_270._M_string_length + local_2e8) goto LAB_0014aae9;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
      }
      else {
LAB_0014aae9:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
      }
      local_310 = (ulong *)*puVar6;
      puVar8 = puVar6 + 2;
      if (local_310 == puVar8) {
        local_300 = *puVar8;
        lStack_2f8 = puVar6[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar8;
      }
      local_308 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)puVar8 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (ulong *)*puVar6;
      puVar8 = puVar6 + 2;
      if (local_2d0 == puVar8) {
        local_2c0 = *puVar8;
        lStack_2b8 = puVar6[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0 = *puVar8;
      }
      local_2c8 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      goto LAB_0014a3a5;
    }
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)*puVar6;
  puVar8 = puVar6 + 2;
  if ((ulong *)local_250._M_dataplus._M_p == puVar8) {
    local_250.field_2._M_allocated_capacity = *puVar8;
    local_250.field_2._8_8_ = puVar6[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar8;
  }
  local_250._M_string_length = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_allocated_capacity = *puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity == paVar11) {
    local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_280._8_8_ = puVar6[3];
    local_290._M_allocated_capacity = (size_type)&local_280;
  }
  else {
    local_280._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_290._8_8_ = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x57a;
  StreamableToString<int>(&local_228,(int *)&local_1a0);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity != &local_280) {
    uVar15 = local_280._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_228._M_string_length + local_290._8_8_) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar15 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_228._M_string_length + local_290._8_8_) goto LAB_0014a099;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_228,0,(char *)0x0,local_290._M_allocated_capacity);
  }
  else {
LAB_0014a099:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_290._M_local_buf,(ulong)local_228._M_dataplus._M_p);
  }
  local_2f0 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2f0 == puVar8) {
    local_2e0 = *puVar8;
    lStack_2d8 = puVar6[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar8;
  }
  local_2e8 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_310 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = puVar6[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar8;
  }
  local_308 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
LAB_0014a34a:
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2d0 == puVar8) {
    local_2c0 = *puVar8;
    lStack_2b8 = puVar6[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar8;
  }
  local_2c8 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
LAB_0014a3a5:
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0.sa_handler = (__sighandler_t)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.sa_handler == paVar11) {
    local_2a0 = (_union_1457)paVar11->_M_allocated_capacity;
    lStack_298 = puVar6[3];
    local_2b0.sa_handler = (__sighandler_t)&local_2a0;
  }
  else {
    local_2a0 = (_union_1457)paVar11->_M_allocated_capacity;
  }
  _Var12 = *(_union_1457 *)(puVar6 + 1);
  p_Var16 = &local_2b0;
LAB_0014a562:
  p_Var16[1] = _Var12;
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort((string *)p_Var16);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}